

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCUtil.cpp
# Opt level: O2

void __thiscall Assimp::IFC::TempOpening::Transform(TempOpening *this,IfcMatrix4 *mat)

{
  TempMesh *pTVar1;
  aiMatrix3x3t<double> local_60;
  
  pTVar1 = (this->profileMesh).super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (pTVar1 != (TempMesh *)0x0) {
    TempMesh::Transform(pTVar1,mat);
  }
  pTVar1 = (this->profileMesh2D).
           super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (pTVar1 != (TempMesh *)0x0) {
    TempMesh::Transform(pTVar1,mat);
  }
  aiMatrix3x3t<double>::aiMatrix3x3t(&local_60,mat);
  aiVector3t<double>::operator*=(&this->extrusionDir,&local_60);
  return;
}

Assistant:

void TempOpening::Transform(const IfcMatrix4& mat) {
    if(profileMesh) {
        profileMesh->Transform(mat);
    }
    if(profileMesh2D) {
        profileMesh2D->Transform(mat);
    }
    extrusionDir *= IfcMatrix3(mat);
}